

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Orphan<capnp::DynamicValue> * __thiscall
capnp::DynamicStruct::Builder::disown
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,Builder *this,Field field)

{
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Field field_04;
  Field field_05;
  Field field_06;
  Field field_07;
  Field field_08;
  undefined8 uVar1;
  void *pvVar2;
  StructDataBitCount SVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  word wVar6;
  SegmentBuilder *pSVar7;
  CapTableBuilder *pCVar8;
  word *pwVar9;
  undefined1 uVar10;
  undefined7 uVar11;
  undefined1 uVar12;
  StructSchema SVar13;
  undefined8 uVar14;
  SegmentReader *pSVar15;
  CapTableReader *pCVar16;
  WirePointer *pWVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 uVar20;
  undefined7 uVar21;
  undefined1 uVar22;
  bool bVar23;
  BuilderArena *pBVar24;
  ulong uVar25;
  Which WVar26;
  Type TVar27;
  Orphan<capnp::DynamicValue> result;
  undefined8 local_330;
  uint uStack_328;
  undefined4 uStack_324;
  Orphan<capnp::DynamicValue> local_318;
  undefined7 uStack_2e0;
  undefined1 uStack_2d9;
  undefined7 uStack_2d8;
  Field field_1;
  IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field> local_288;
  BuilderFor<capnp::DynamicStruct> src;
  Orphan<capnp::DynamicStruct> result_1;
  Builder dst;
  Builder local_e8;
  Builder local_a8;
  Reader local_68;
  
  pvVar2 = field.proto._reader.data;
  SVar3 = field.proto._reader.dataSize;
  if (0x4f < field.proto._reader.dataSize) {
    if (*(short *)((long)field.proto._reader.data + 8) == 1) {
      get((Builder *)&result,this,field);
      DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&src,(Builder *)&result);
      DynamicValue::Builder::~Builder((Builder *)&result);
      result.builder.segment = *(SegmentBuilder **)&(this->builder).dataSize;
      result._0_8_ = (this->builder).segment;
      result.field_1.intValue = (int64_t)(this->builder).capTable;
      result.field_1.listSchema.elementType.field_4 =
           (anon_union_8_2_eba6ea51_for_Type_5)(this->builder).data;
      result.builder.tag.content = (uint64_t)(this->builder).pointers;
      pBVar24 = capnp::_::StructBuilder::getArena((StructBuilder *)&result);
      result.field_1.intValue =
           (int64_t)capnp::_::StructBuilder::getCapTable((StructBuilder *)&result);
      result._0_8_ = pBVar24;
      Orphanage::newOrphan(&result_1,(Orphanage *)&result,src.schema);
      Orphan<capnp::DynamicStruct>::get(&dst,&result_1);
      which((Maybe<capnp::StructSchema::Field> *)&result,&src);
      uVar22 = uStack_2d9;
      uVar21 = uStack_2e0;
      uVar20 = local_318.builder.location._7_1_;
      pwVar9 = result.builder.location;
      pCVar8 = result.builder.capTable;
      pSVar7 = result.builder.segment;
      wVar6 = result.builder.tag;
      uVar5 = result.field_1.listSchema.elementType.field_4;
      uVar4 = result.field_1.intValue;
      local_318.builder.location._7_1_ = (undefined1)local_330;
      uVar10 = local_318.builder.location._7_1_;
      uStack_2e0 = (undefined7)((ulong)local_330 >> 8);
      uVar11 = uStack_2e0;
      uStack_2d9 = (undefined1)uStack_328;
      uVar12 = uStack_2d9;
      if ((undefined1)result.type == VOID) {
        uVar1 = CONCAT44(uStack_324,uStack_328);
        uStack_2d8 = (undefined7)((ulong)uVar1 >> 8);
        local_318.builder.segment._7_1_ = SUB81(result.builder.capTable,0);
        local_318.builder.capTable._0_7_ = (undefined7)((ulong)result.builder.capTable >> 8);
        local_318.builder.capTable._7_1_ = SUB81(result.builder.location,0);
        local_318.builder.location._0_7_ = (undefined7)((ulong)result.builder.location >> 8);
        local_318.field_1.field9[0xf] = (undefined1)result.builder.tag.content;
        local_318.builder.tag.content._0_7_ = (undefined7)(result.builder.tag.content >> 8);
        local_318.builder.tag.content._7_1_ = SUB81(result.builder.segment,0);
        local_318.builder.segment._0_7_ = (undefined7)((ulong)result.builder.segment >> 8);
        local_318._7_1_ = SUB81(result.field_1.intValue,0);
        local_318.field_1.intValue._0_7_ = (undefined7)((ulong)result.field_1._0_8_ >> 8);
        local_318.field_1.field9[7] = result.field_1._8_1_;
        local_318.field_1._8_7_ = result.field_1._9_7_;
        field_02._8_8_ = result.field_1.listSchema.elementType.field_4;
        field_02.parent.super_Schema.raw = (Schema)(Schema)result.field_1.intValue;
        field_02.proto._reader.segment = (SegmentReader *)result.builder.tag.content;
        field_02.proto._reader.capTable = (CapTableReader *)result.builder.segment;
        field_02.proto._reader.data = result.builder.capTable;
        field_02.proto._reader.pointers = (WirePointer *)result.builder.location;
        field_02.proto._reader._32_8_ = local_330;
        field_02.proto._reader._40_8_ = uVar1;
        disown(&result,&src,field_02);
        field_03._8_8_ = uVar5;
        field_03.parent.super_Schema.raw = (Schema)(Schema)uVar4;
        field_03.proto._reader.segment = (SegmentReader *)wVar6.content;
        field_03.proto._reader.capTable = (CapTableReader *)pSVar7;
        field_03.proto._reader.data = pCVar8;
        field_03.proto._reader.pointers = (WirePointer *)pwVar9;
        field_03.proto._reader._32_8_ = local_330;
        field_03.proto._reader._40_8_ = uVar1;
        adopt(&dst,field_03,&result);
        capnp::_::OrphanBuilder::~OrphanBuilder(&result.builder);
        uVar20 = local_318.builder.location._7_1_;
        uVar21 = uStack_2e0;
        uVar22 = uStack_2d9;
      }
      uStack_2d9 = uVar22;
      uStack_2e0 = uVar21;
      local_318.builder.location._7_1_ = uVar20;
      StructSchema::getFieldByDiscriminant
                ((Maybe<capnp::StructSchema::Field> *)&result,&src.schema,0);
      if ((undefined1)result.type == VOID) {
        uStack_2d8 = (undefined7)(CONCAT44(uStack_324,uStack_328) >> 8);
        local_318.builder.segment._7_1_ = SUB81(result.builder.capTable,0);
        local_318.builder.capTable._0_7_ = (undefined7)((ulong)result.builder.capTable >> 8);
        local_318.builder.capTable._7_1_ = SUB81(result.builder.location,0);
        local_318.builder.location._0_7_ = (undefined7)((ulong)result.builder.location >> 8);
        local_318.field_1.field9[0xf] = (undefined1)result.builder.tag.content;
        local_318.builder.tag.content._0_7_ = (undefined7)(result.builder.tag.content >> 8);
        local_318.builder.tag.content._7_1_ = SUB81(result.builder.segment,0);
        local_318.builder.segment._0_7_ = (undefined7)((ulong)result.builder.segment >> 8);
        local_318._7_1_ = SUB81(result.field_1.intValue,0);
        local_318.field_1.intValue._0_7_ = (undefined7)((ulong)result.field_1._0_8_ >> 8);
        local_318.field_1.field9[7] = result.field_1._8_1_;
        local_318.field_1._8_7_ = result.field_1._9_7_;
        field_04._8_8_ = result.field_1.listSchema.elementType.field_4;
        field_04.parent.super_Schema.raw = (Schema)(Schema)result.field_1.intValue;
        field_04.proto._reader.segment = (SegmentReader *)result.builder.tag.content;
        field_04.proto._reader.capTable = (CapTableReader *)result.builder.segment;
        field_04.proto._reader.data = result.builder.capTable;
        field_04.proto._reader.pointers = (WirePointer *)result.builder.location;
        field_04.proto._reader._32_8_ = local_330;
        field_04.proto._reader._40_8_ = CONCAT44(uStack_324,uStack_328);
        local_318.builder.location._7_1_ = uVar10;
        uStack_2e0 = uVar11;
        uStack_2d9 = uVar12;
        clear(&src,field_04);
      }
      StructSchema::getNonUnionFields((FieldSubset *)&result,&src.schema);
      local_288.container = (FieldSubset *)&result;
      for (local_288.index = 0; local_288.index != uStack_328; local_288.index = local_288.index + 1
          ) {
        capnp::_::
        IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>::
        operator*(&field_1,&local_288);
        local_318.builder.location._0_7_ = field_1.proto._reader._32_7_;
        local_318.builder.location._7_1_ = field_1.proto._reader._39_1_;
        uStack_2e0 = field_1.proto._reader._40_7_;
        uStack_2d9 = field_1.proto._reader._47_1_;
        local_318.builder.segment._0_7_ = SUB87(field_1.proto._reader.data,0);
        local_318.builder.segment._7_1_ = (undefined1)((ulong)field_1.proto._reader.data >> 0x38);
        local_318.builder.capTable._0_7_ = SUB87(field_1.proto._reader.pointers,0);
        local_318.builder.capTable._7_1_ =
             (undefined1)((ulong)field_1.proto._reader.pointers >> 0x38);
        local_318.field_1._8_7_ = SUB87(field_1.proto._reader.segment,0);
        local_318.field_1.field9[0xf] = (undefined1)((ulong)field_1.proto._reader.segment >> 0x38);
        local_318.builder.tag.content._0_7_ = SUB87(field_1.proto._reader.capTable,0);
        local_318.builder.tag.content._7_1_ =
             (undefined1)((ulong)field_1.proto._reader.capTable >> 0x38);
        local_318._0_7_ = field_1.parent.super_Schema.raw._0_7_;
        local_318._7_1_ = field_1.parent.super_Schema.raw._7_1_;
        local_318.field_1.intValue._0_7_ = field_1._8_7_;
        local_318.field_1.field9[7] = field_1._15_1_;
        asReader(&local_68,&src);
        field_05.parent.super_Schema.raw._7_1_ = local_318._7_1_;
        field_05.parent.super_Schema.raw._0_4_ = local_318.type;
        field_05.parent.super_Schema.raw._4_3_ = local_318._4_3_;
        field_05._15_1_ = local_318.field_1.field9[7];
        field_05._8_7_ = local_318.field_1.intValue._0_7_;
        field_05.proto._reader.segment._7_1_ = local_318.field_1.field9[0xf];
        field_05.proto._reader.segment._0_7_ = local_318.field_1._8_7_;
        field_05.proto._reader.capTable._7_1_ = local_318.builder.tag.content._7_1_;
        field_05.proto._reader.capTable._0_7_ = (undefined7)local_318.builder.tag.content;
        field_05.proto._reader.data._7_1_ = local_318.builder.segment._7_1_;
        field_05.proto._reader.data._0_7_ = local_318.builder.segment._0_7_;
        field_05.proto._reader.pointers._7_1_ = local_318.builder.capTable._7_1_;
        field_05.proto._reader.pointers._0_7_ = local_318.builder.capTable._0_7_;
        field_05.proto._reader._39_1_ = local_318.builder.location._7_1_;
        field_05.proto._reader.dataSize = local_318.builder.location._0_4_;
        field_05.proto._reader.pointerCount = local_318.builder.location._4_2_;
        field_05.proto._reader._38_1_ = local_318.builder.location._6_1_;
        field_05.proto._reader._47_1_ = uStack_2d9;
        field_05.proto._reader._40_7_ = uStack_2e0;
        bVar23 = DynamicStruct::Reader::has(&local_68,field_05,NON_NULL);
        uVar1 = field_1.proto._reader._40_8_;
        uVar5 = field_1.proto._reader._32_8_;
        pWVar17 = field_1.proto._reader.pointers;
        pvVar2 = field_1.proto._reader.data;
        pCVar16 = field_1.proto._reader.capTable;
        pSVar15 = field_1.proto._reader.segment;
        uVar4 = field_1._8_8_;
        SVar13 = field_1.parent;
        if (bVar23) {
          field_06.index = field_1.index;
          field_06._12_4_ = field_1._12_4_;
          field_06.parent = (StructSchema)(StructSchema)field_1.parent.super_Schema.raw;
          field_06.proto._reader.segment = field_1.proto._reader.segment;
          field_06.proto._reader.capTable = field_1.proto._reader.capTable;
          field_06.proto._reader.data = field_1.proto._reader.data;
          field_06.proto._reader.pointers = field_1.proto._reader.pointers;
          field_06.proto._reader.dataSize = field_1.proto._reader.dataSize;
          field_06.proto._reader.pointerCount = field_1.proto._reader.pointerCount;
          field_06.proto._reader._38_2_ = field_1.proto._reader._38_2_;
          field_06.proto._reader.nestingLimit = field_1.proto._reader.nestingLimit;
          field_06.proto._reader._44_4_ = field_1.proto._reader._44_4_;
          disown(&local_318,&src,field_06);
          uVar19 = field_1.proto._reader._40_8_;
          uVar18 = field_1.proto._reader._32_8_;
          uVar14 = field_1._8_8_;
          field_1.index = (uint)uVar4;
          field_1._12_4_ = SUB84(uVar4,4);
          field_07.index = field_1.index;
          field_07._12_4_ = field_1._12_4_;
          field_07.parent = (StructSchema)(StructSchema)SVar13.super_Schema.raw;
          field_07.proto._reader.segment = pSVar15;
          field_07.proto._reader.capTable = pCVar16;
          field_07.proto._reader.data = pvVar2;
          field_07.proto._reader.pointers = pWVar17;
          field_1.proto._reader.dataSize = (StructDataBitCount)uVar5;
          field_1.proto._reader.pointerCount = SUB82(uVar5,4);
          field_1.proto._reader._38_2_ = SUB82(uVar5,6);
          field_07.proto._reader.dataSize = field_1.proto._reader.dataSize;
          field_07.proto._reader.pointerCount = field_1.proto._reader.pointerCount;
          field_07.proto._reader._38_2_ = field_1.proto._reader._38_2_;
          field_1.proto._reader.nestingLimit = (int)uVar1;
          field_1.proto._reader._44_4_ = SUB84(uVar1,4);
          field_07.proto._reader.nestingLimit = field_1.proto._reader.nestingLimit;
          field_07.proto._reader._44_4_ = field_1.proto._reader._44_4_;
          field_1._8_8_ = uVar14;
          field_1.proto._reader._32_8_ = uVar18;
          field_1.proto._reader._40_8_ = uVar19;
          adopt(&dst,field_07,&local_318);
          capnp::_::OrphanBuilder::~OrphanBuilder(&local_318.builder);
        }
      }
      Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>(__return_storage_ptr__,&result_1);
      capnp::_::OrphanBuilder::~OrphanBuilder(&result_1.builder);
      return __return_storage_ptr__;
    }
    if (*(short *)((long)field.proto._reader.data + 8) != 0) goto LAB_0025a2e7;
  }
  TVar27 = StructSchema::Field::getType(&field);
  WVar26 = LIST;
  if (((undefined1  [16])TVar27 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
    WVar26 = TVar27.baseType;
  }
  if (WVar26 < (ANY_POINTER|BOOL)) {
    if ((0x8fffU >> (WVar26 & 0x1f) & 1) == 0) {
      field_08.proto._reader.pointerCount = field.proto._reader.pointerCount;
      field_08.proto._reader._38_2_ = field.proto._reader._38_2_;
      field_08.proto._reader.dataSize = field.proto._reader.dataSize;
      field_08.index = field.index;
      field_08._12_4_ = field._12_4_;
      field_08.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
      field_08.proto._reader.segment = field.proto._reader.segment;
      field_08.proto._reader.capTable = field.proto._reader.capTable;
      field_08.proto._reader.data = field.proto._reader.data;
      field_08.proto._reader.pointers = field.proto._reader.pointers;
      field_08.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
      field_08.proto._reader._44_4_ = field.proto._reader._44_4_;
      get((Builder *)&result,this,field_08);
      DynamicValue::Builder::Builder(&local_e8,(Builder *)&result);
      if (SVar3 < 0x40) {
        uVar25 = 0;
      }
      else {
        uVar25 = (ulong)*(uint *)((long)pvVar2 + 4);
      }
      field_1.proto._reader.segment = (SegmentReader *)((this->builder).pointers + uVar25);
      field_1.parent.super_Schema.raw = (Schema)(this->builder).segment;
      field_1._8_8_ = (this->builder).capTable;
      capnp::_::PointerBuilder::disown((OrphanBuilder *)&local_318,(PointerBuilder *)&field_1);
      Orphan<capnp::DynamicValue>::Orphan
                (__return_storage_ptr__,&local_e8,(OrphanBuilder *)&local_318);
      capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&local_318);
      DynamicValue::Builder::~Builder(&local_e8);
      DynamicValue::Builder::~Builder((Builder *)&result);
    }
    else {
      field_00.proto._reader.pointerCount = field.proto._reader.pointerCount;
      field_00.proto._reader._38_2_ = field.proto._reader._38_2_;
      field_00.proto._reader.dataSize = field.proto._reader.dataSize;
      field_00.index = field.index;
      field_00._12_4_ = field._12_4_;
      field_00.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
      field_00.proto._reader.segment = field.proto._reader.segment;
      field_00.proto._reader.capTable = field.proto._reader.capTable;
      field_00.proto._reader.data = field.proto._reader.data;
      field_00.proto._reader.pointers = field.proto._reader.pointers;
      field_00.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
      field_00.proto._reader._44_4_ = field.proto._reader._44_4_;
      get(&local_a8,this,field_00);
      local_318.field_1._8_7_ = 0;
      local_318.field_1.field9[0xf] = 0;
      local_318.builder.tag.content._0_7_ = 0;
      local_318.builder.tag.content._7_1_ = 0;
      local_318.type = UNKNOWN;
      local_318._4_3_ = 0;
      local_318._7_1_ = 0;
      local_318.field_1.intValue._0_7_ = 0;
      local_318.field_1.field9[7] = 0;
      Orphan<capnp::DynamicValue>::Orphan(&result,&local_a8,(OrphanBuilder *)&local_318);
      capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&local_318);
      DynamicValue::Builder::~Builder(&local_a8);
      field_01.proto._reader.pointerCount = field.proto._reader.pointerCount;
      field_01.proto._reader._38_2_ = field.proto._reader._38_2_;
      field_01.proto._reader.dataSize = field.proto._reader.dataSize;
      field_01.index = field.index;
      field_01._12_4_ = field._12_4_;
      field_01.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
      field_01.proto._reader.segment = field.proto._reader.segment;
      field_01.proto._reader.capTable = field.proto._reader.capTable;
      field_01.proto._reader.data = field.proto._reader.data;
      field_01.proto._reader.pointers = field.proto._reader.pointers;
      field_01.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
      field_01.proto._reader._44_4_ = field.proto._reader._44_4_;
      clear(this,field_01);
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,&result);
      capnp::_::OrphanBuilder::~OrphanBuilder(&result.builder);
    }
    return __return_storage_ptr__;
  }
LAB_0025a2e7:
  kj::_::unreachable();
}

Assistant:

Orphan<DynamicValue> DynamicStruct::Builder::disown(StructSchema::Field field) {
  // We end up calling get(field) below, so we don't need to validate `field` here.

  auto proto = field.getProto();
  switch (proto.which()) {
    case schema::Field::SLOT: {
      auto slot = proto.getSlot();

      switch (field.getType().which()) {
        case schema::Type::VOID:
        case schema::Type::BOOL:
        case schema::Type::INT8:
        case schema::Type::INT16:
        case schema::Type::INT32:
        case schema::Type::INT64:
        case schema::Type::UINT8:
        case schema::Type::UINT16:
        case schema::Type::UINT32:
        case schema::Type::UINT64:
        case schema::Type::FLOAT32:
        case schema::Type::FLOAT64:
        case schema::Type::ENUM: {
          auto result = Orphan<DynamicValue>(get(field), _::OrphanBuilder());
          clear(field);
          return kj::mv(result);
        }

        case schema::Type::TEXT:
        case schema::Type::DATA:
        case schema::Type::LIST:
        case schema::Type::STRUCT:
        case schema::Type::ANY_POINTER:
        case schema::Type::INTERFACE: {
          auto value = get(field);
          return Orphan<DynamicValue>(
              value, builder.getPointerField(assumePointerOffset(slot.getOffset())).disown());
        }
      }
      KJ_UNREACHABLE;
    }

    case schema::Field::GROUP: {
      // We have to allocate new space for the group, unfortunately.
      auto src = get(field).as<DynamicStruct>();

      Orphan<DynamicStruct> result =
          Orphanage::getForMessageContaining(*this).newOrphan(src.getSchema());
      auto dst = result.get();

      KJ_IF_MAYBE(unionField, src.which()) {
        dst.adopt(*unionField, src.disown(*unionField));
      }

      // We need to explicitly reset the union to its default field.
      KJ_IF_MAYBE(unionField, src.schema.getFieldByDiscriminant(0)) {
        src.clear(*unionField);
      }

      for (auto field: src.schema.getNonUnionFields()) {
        if (src.has(field)) {
          dst.adopt(field, src.disown(field));
        }
      }

      return kj::mv(result);
    }
  }

  KJ_UNREACHABLE;
}